

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int nni_msg_insert(nni_msg *m,void *data,size_t len)

{
  int iVar1;
  size_t len_local;
  void *data_local;
  nni_msg *m_local;
  
  iVar1 = nni_chunk_insert(&m->m_body,data,len);
  return iVar1;
}

Assistant:

int
nni_msg_insert(nni_msg *m, const void *data, size_t len)
{
	return (nni_chunk_insert(&m->m_body, data, len));
}